

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPlane::IfcPlane(IfcPlane *this)

{
  IfcPlane *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcElementarySurface).field_0x58,"IfcPlane");
  IfcElementarySurface::IfcElementarySurface
            (&this->super_IfcElementarySurface,&PTR_construction_vtable_24__00f53cd0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlane,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlane,_0UL> *)
             &(this->super_IfcElementarySurface).field_0x48,&PTR_construction_vtable_24__00f53d80);
  (this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf53bf0;
  *(undefined8 *)&(this->super_IfcElementarySurface).field_0x58 = 0xf53cb8;
  *(undefined8 *)
   &(this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf53c18;
  *(undefined8 *)
   &(this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf53c40;
  *(undefined8 *)
   &(this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    field_0x30 = 0xf53c68;
  *(undefined8 *)&(this->super_IfcElementarySurface).field_0x48 = 0xf53c90;
  return;
}

Assistant:

IfcPlane() : Object("IfcPlane") {}